

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20240722::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  undefined8 *puVar1;
  Arg *in_R9;
  string_view format;
  Arg AStack_78;
  undefined8 local_48;
  undefined8 local_40;
  
  puVar1 = *(undefined8 **)(**(long **)this + 8);
  local_40 = *puVar1;
  local_48 = puVar1[1];
  substitute_internal::Arg::Arg(&AStack_78,*(int *)(**(long **)this + 4));
  format._M_str = (char *)&local_48;
  format._M_len = (size_t)"Field \"$0\" uses reserved number $1.";
  Substitute_abi_cxx11_(__return_storage_ptr__,(lts_20240722 *)0x23,format,&AStack_78,in_R9);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}